

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O1

Rwr_Node_t *
Rwr_ManAddNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  Rwr_Node_t *pNode;
  void **ppvVar3;
  Rwr_Node_t **ppList;
  uint uVar4;
  int iVar5;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar2 = *(uint *)&p0->field_0xe;
    }
    else {
      uVar2 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 0xe);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar4 = *(uint *)&p1->field_0xe;
    }
    else {
      uVar4 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0xe);
    }
    uVar4 = uVar4 & uVar2;
  }
  else {
    uVar4 = *(uint *)&p1->field_0xe ^ *(uint *)&p0->field_0xe;
  }
  pNode = (Rwr_Node_t *)Extra_MmFixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0xe =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar4 & 0xffff;
  pNode->p0 = p0;
  pNode->p1 = p1;
  pNode->pNext = (Rwr_Node_t *)0x0;
  pVVar1 = p->vForest;
  uVar2 = pVVar1->nCap;
  if (pVVar1->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_008c4911;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,(ulong)uVar2 << 4);
      }
      pVVar1->pArray = ppvVar3;
    }
    pVVar1->nCap = iVar5;
  }
LAB_008c4911:
  iVar5 = pVVar1->nSize;
  pVVar1->nSize = iVar5 + 1;
  pVVar1->pArray[iVar5] = pNode;
  ppList = (Rwr_Node_t **)(ulong)(uVar4 & 0xffff);
  if (p->puCanons[(long)ppList] == (unsigned_short)uVar4) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[(long)ppList] == (Rwr_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    Rwr_ListAddToTail(ppList,pNode);
  }
  return pNode;
}

Assistant:

Rwr_Node_t * Rwr_ManAddNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwr_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}